

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

bool __thiscall DReachabilityPropagator::checkFinalSatisfied(DReachabilityPropagator *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  DReachabilityPropagator *in_RDI;
  reference rVar5;
  int i;
  vector<bool,_std::allocator<bool>_> v;
  undefined8 in_stack_ffffffffffffff18;
  GraphPropagator *in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  bool *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff40;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  DReachabilityPropagator *in_stack_ffffffffffffff70;
  reference local_60;
  int local_50;
  undefined1 local_39;
  byte local_1;
  
  GraphPropagator::nbNodes((GraphPropagator *)0x2b1441);
  local_39 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x2b1462);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  std::allocator<bool>::~allocator((allocator<bool> *)0x2b1490);
  get_root_idx(in_RDI);
  verificationDFS(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
  local_50 = 0;
  do {
    iVar1 = local_50;
    iVar3 = GraphPropagator::nbNodes((GraphPropagator *)0x2b14d0);
    if (iVar3 <= iVar1) {
      local_1 = 1;
LAB_002b16ca:
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x2b16d7);
      return (bool)(local_1 & 1);
    }
    GraphPropagator::getNodeVar
              (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    bVar2 = BoolView::isFixed((BoolView *)0x2b1508);
    if (bVar2) {
      GraphPropagator::getNodeVar
                (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      bVar2 = BoolView::isTrue((BoolView *)in_stack_ffffffffffffff20);
      if (bVar2) {
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        local_60 = rVar5;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_60);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "DreachabilityPropagator not satisfied (cannot reach node ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_50);
          poVar4 = std::operator<<(poVar4,") ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/dconnected.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x363);
          std::operator<<(poVar4,'\n');
          local_1 = 0;
          goto LAB_002b16ca;
        }
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool DReachabilityPropagator::checkFinalSatisfied() {
	std::vector<bool> v = std::vector<bool>(nbNodes(), false);
	verificationDFS(get_root_idx(), v);
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed() && getNodeVar(i).isTrue()) {
			assert(v[i]);
			if (!v[i]) {
				std::cerr << "DreachabilityPropagator not satisfied (cannot reach node " << i << ") "
									<< __FILE__ << ":" << __LINE__ << '\n';
				return false;
			}
		}
	}

	return true;
}